

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_time.cc
# Opt level: O0

LPSTRUC_MSG_HEADER __thiscall CSocekt::RemoveFirstTimer(CSocekt *this)

{
  _STRUC_MSG_HEADER *p_Var1;
  pointer ppVar2;
  multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
  *in_RDI;
  LPSTRUC_MSG_HEADER p_tmp;
  iterator pos;
  multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
  *in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc8;
  _Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_> local_18 [2];
  _STRUC_MSG_HEADER *local_8;
  
  std::_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>::_Rb_tree_iterator(local_18);
  if (in_RDI[0x8c]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_8 = (_STRUC_MSG_HEADER *)0x0;
  }
  else {
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,__STRUC_MSG_HEADER_*>_> *)0x1432b1);
    p_Var1 = ppVar2->second;
    std::
    multimap<long,_STRUC_MSG_HEADER*,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
    ::erase_abi_cxx11_(in_RDI,in_stack_ffffffffffffffc8);
    in_RDI[0x8c]._M_t._M_impl.super__Rb_tree_header._M_node_count =
         in_RDI[0x8c]._M_t._M_impl.super__Rb_tree_header._M_node_count - 1;
    local_8 = p_Var1;
  }
  return local_8;
}

Assistant:

LPSTRUC_MSG_HEADER CSocekt::RemoveFirstTimer()
{
	std::multimap<time_t, LPSTRUC_MSG_HEADER>::iterator pos;	
	LPSTRUC_MSG_HEADER p_tmp;
	if(m_cur_size_ <= 0)
	{
		return NULL;
	}
	pos = m_timerQueuemap.begin(); //调用者负责互斥的，这里直接操作没问题的
	p_tmp = pos->second;
	m_timerQueuemap.erase(pos);
	--m_cur_size_;
	return p_tmp;
}